

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

xmlChar * xmlValidNormalizeAttributeValue
                    (xmlDocPtr doc,xmlNodePtr elem,xmlChar *name,xmlChar *value)

{
  xmlChar *pxVar1;
  undefined4 in_EAX;
  int iVar2;
  xmlChar *pxVar3;
  xmlAttributePtr pxVar4;
  xmlChar *pxVar5;
  xmlChar xVar6;
  xmlChar *pxVar7;
  undefined1 auVar8 [16];
  xmlChar fn [50];
  xmlChar axStack_68 [64];
  
  auVar8._0_4_ = -(uint)(doc == (xmlDocPtr)0x0);
  auVar8._4_4_ = -(uint)(elem == (xmlNodePtr)0x0);
  auVar8._8_4_ = -(uint)(name == (xmlChar *)0x0);
  auVar8._12_4_ = -(uint)(value == (xmlChar *)0x0);
  iVar2 = movmskps(in_EAX,auVar8);
  if (iVar2 != 0) {
    return (xmlChar *)0x0;
  }
  if ((elem->ns != (xmlNs *)0x0) && (pxVar3 = elem->ns->prefix, pxVar3 != (xmlChar *)0x0)) {
    pxVar3 = xmlBuildQName(elem->name,pxVar3,axStack_68,0x32);
    if (pxVar3 == (xmlChar *)0x0) {
      return (xmlChar *)0x0;
    }
    if ((pxVar3 != axStack_68) && (pxVar3 != elem->name)) {
      (*xmlFree)(pxVar3);
    }
  }
  pxVar4 = xmlGetDtdAttrDesc(doc->intSubset,elem->name,name);
  if ((((pxVar4 == (xmlAttributePtr)0x0) &&
       ((doc->extSubset == (xmlDtdPtr)0x0 ||
        (pxVar4 = xmlGetDtdAttrDesc(doc->extSubset,elem->name,name), pxVar4 == (xmlAttributePtr)0x0)
        ))) || (pxVar4->atype == XML_ATTRIBUTE_CDATA)) ||
     (pxVar3 = xmlStrdup(value), pxVar3 == (xmlChar *)0x0)) {
    return (xmlChar *)0x0;
  }
  pxVar7 = value + -1;
  do {
    xVar6 = pxVar7[1];
    pxVar7 = pxVar7 + 1;
    pxVar5 = pxVar3;
  } while (xVar6 == ' ');
  do {
    if (xVar6 == ' ') {
      while (xVar6 == ' ') {
        pxVar1 = pxVar7 + 1;
        pxVar7 = pxVar7 + 1;
        xVar6 = *pxVar1;
      }
      if (xVar6 != '\0') {
        xVar6 = ' ';
        goto LAB_0019571a;
      }
    }
    else {
      if (xVar6 == '\0') {
        *pxVar5 = '\0';
        return pxVar3;
      }
      pxVar7 = pxVar7 + 1;
LAB_0019571a:
      *pxVar5 = xVar6;
      pxVar5 = pxVar5 + 1;
    }
    xVar6 = *pxVar7;
  } while( true );
}

Assistant:

xmlChar *
xmlValidNormalizeAttributeValue(xmlDocPtr doc, xmlNodePtr elem,
			        const xmlChar *name, const xmlChar *value) {
    xmlChar *ret, *dst;
    const xmlChar *src;
    xmlAttributePtr attrDecl = NULL;

    if (doc == NULL) return(NULL);
    if (elem == NULL) return(NULL);
    if (name == NULL) return(NULL);
    if (value == NULL) return(NULL);

    if ((elem->ns != NULL) && (elem->ns->prefix != NULL)) {
	xmlChar fn[50];
	xmlChar *fullname;

	fullname = xmlBuildQName(elem->name, elem->ns->prefix, fn, 50);
	if (fullname == NULL)
	    return(NULL);
	if ((fullname != fn) && (fullname != elem->name))
	    xmlFree(fullname);
    }
    attrDecl = xmlGetDtdAttrDesc(doc->intSubset, elem->name, name);
    if ((attrDecl == NULL) && (doc->extSubset != NULL))
	attrDecl = xmlGetDtdAttrDesc(doc->extSubset, elem->name, name);

    if (attrDecl == NULL)
	return(NULL);
    if (attrDecl->atype == XML_ATTRIBUTE_CDATA)
	return(NULL);

    ret = xmlStrdup(value);
    if (ret == NULL)
	return(NULL);
    src = value;
    dst = ret;
    while (*src == 0x20) src++;
    while (*src != 0) {
	if (*src == 0x20) {
	    while (*src == 0x20) src++;
	    if (*src != 0)
		*dst++ = 0x20;
	} else {
	    *dst++ = *src++;
	}
    }
    *dst = 0;
    return(ret);
}